

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O3

void check_variant_value<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>,int>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *var,
               int *val)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  int *piVar5;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_160;
  AssertionHandler local_150;
  undefined1 local_108 [16];
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *local_f8;
  char *pcStack_f0;
  size_t sStack_e8;
  int *local_e0;
  int *local_d8;
  undefined8 local_d0;
  strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
  local_c8;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x31;
  local_d8 = val;
  Catch::StringRef::StringRef(&local_40,"var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_40,Normal);
  local_108[0] = (var->storage_).storage_.cur_type_.
                 super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                 .value_ != 0;
  Catch::AssertionHandler::handleExpr<bool>(&local_150,(ExprLhs<bool> *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x32;
  Catch::StringRef::StringRef(&local_50,"var");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_50,Normal);
  local_108._0_8_ = var;
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
            (&local_150,
             (ExprLhs<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
              *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x35;
  Catch::StringRef::StringRef
            (&local_60,"var.type() == typename Variant::type_id(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_60,Normal);
  uVar3 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  local_d0 = 1;
  local_c8.value_ = uVar3;
  Catch::StringRef::StringRef((StringRef *)&local_160,"==");
  local_108[9] = uVar3 == 1;
  local_108[8] = true;
  local_108._0_8_ = &PTR_streamReconstructedExpression_00230930;
  pcStack_f0 = local_160.file;
  sStack_e8 = local_160.line;
  local_f8 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             &local_c8;
  local_e0 = (int *)&local_d0;
  Catch::AssertionHandler::handleExpr(&local_150,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x36;
  Catch::StringRef::StringRef(&local_70,"var.has_value(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_70,Normal);
  local_108[0] = (var->storage_).storage_.cur_type_.
                 super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                 .value_ == 1;
  Catch::AssertionHandler::handleExpr<bool>(&local_150,(ExprLhs<bool> *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x39;
  Catch::StringRef::StringRef(&local_80,"var.value(variant_type<T>{}) == val");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_80,Normal);
  type_safe::tagged_union<int,_double,_debugger_type>::check<int>
            ((tagged_union<int,_double,_debugger_type> *)var);
  piVar5 = local_d8;
  iVar1 = *(int *)(var->storage_).storage_.storage_.storage_;
  iVar2 = *local_d8;
  Catch::StringRef::StringRef((StringRef *)&local_160,"==");
  local_108[9] = iVar1 == iVar2;
  local_108[8] = true;
  local_108._0_8_ = &PTR_streamReconstructedExpression_0022f648;
  pcStack_f0 = local_160.file;
  sStack_e8 = local_160.line;
  local_e0 = piVar5;
  local_f8 = var;
  Catch::AssertionHandler::handleExpr(&local_150,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x40;
  Catch::StringRef::StringRef(&local_90,"!var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_90,Normal);
  local_108[0] = (var->storage_).storage_.cur_type_.
                 super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                 .value_ != 0;
  Catch::AssertionHandler::handleExpr<bool>(&local_150,(ExprLhs<bool> *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x41;
  Catch::StringRef::StringRef
            (&local_a0,"bool(var.optional_value(variant_type<int>{})) == is_int::value");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_a0,Normal);
  uVar3 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar3 == 1) {
    type_safe::tagged_union<int,_double,_debugger_type>::check<int>
              ((tagged_union<int,_double,_debugger_type> *)var);
  }
  Catch::StringRef::StringRef((StringRef *)&local_160,"==");
  uVar4 = local_108._8_8_;
  local_108[9] = uVar3 == 1;
  local_108[8] = true;
  local_108._0_8_ = &PTR_streamReconstructedExpression_0022f708;
  local_108._11_5_ = SUB85(uVar4,3);
  local_108[10] = uVar3 == 1;
  local_f8 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             local_160.file;
  pcStack_f0 = (char *)local_160.line;
  sStack_e8 = CONCAT71(sStack_e8._1_7_,1);
  Catch::AssertionHandler::handleExpr(&local_150,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x42;
  Catch::StringRef::StringRef
            (&local_b0,"bool(var.optional_value(variant_type<double>{})) == is_double::value");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_b0,Normal);
  uVar3 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar3 == 2) {
    type_safe::tagged_union<int,_double,_debugger_type>::check<double>
              ((tagged_union<int,_double,_debugger_type> *)var);
  }
  Catch::StringRef::StringRef((StringRef *)&local_160,"==");
  uVar4 = local_108._8_8_;
  local_108[9] = uVar3 != 2;
  local_108[8] = true;
  local_108._0_8_ = &PTR_streamReconstructedExpression_0022f708;
  local_108._11_5_ = SUB85(uVar4,3);
  local_108[10] = uVar3 == 2;
  local_f8 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             local_160.file;
  pcStack_f0 = (char *)local_160.line;
  sStack_e8 = sStack_e8 & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr(&local_150,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_108._0_8_ = "REQUIRE";
  local_108._8_8_ = 7;
  local_160.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
  local_160.line = 0x43;
  Catch::StringRef::StringRef
            (&local_c0,"bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value");
  Catch::AssertionHandler::AssertionHandler
            (&local_150,(StringRef *)local_108,&local_160,local_c0,Normal);
  uVar3 = (var->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar3 == 3) {
    type_safe::tagged_union<int,_double,_debugger_type>::check<debugger_type>
              ((tagged_union<int,_double,_debugger_type> *)var);
  }
  Catch::StringRef::StringRef((StringRef *)&local_160,"==");
  uVar4 = local_108._8_8_;
  local_108[9] = uVar3 != 3;
  local_108[8] = true;
  local_108._0_8_ = &PTR_streamReconstructedExpression_0022f708;
  local_108._11_5_ = SUB85(uVar4,3);
  local_108[10] = uVar3 == 3;
  local_f8 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             local_160.file;
  pcStack_f0 = (char *)local_160.line;
  sStack_e8 = sStack_e8 & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr(&local_150,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&local_150);
  if (local_150.m_completed == false) {
    (*(local_150.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void check_variant_value(const Variant& var, const T& val)
{
    // boolean queries
    REQUIRE(var.has_value());
    REQUIRE(var);

    // type queries
    REQUIRE(var.type() == typename Variant::type_id(variant_type<T>{}));
    REQUIRE(var.has_value(variant_type<T>{}));

    // value query
    REQUIRE(var.value(variant_type<T>{}) == val);

    // optional_value queries
    using is_int    = std::is_same<T, int>;
    using is_double = std::is_same<T, double>;
    using is_dbg    = std::is_same<T, debugger_type>;

    REQUIRE(!var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(bool(var.optional_value(variant_type<int>{})) == is_int::value);
    REQUIRE(bool(var.optional_value(variant_type<double>{})) == is_double::value);
    REQUIRE(bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value);
}